

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath_p.h
# Opt level: O2

void __thiscall
QPainterPathPrivate::QPainterPathPrivate(QPainterPathPrivate *this,QPainterPathPrivate *other)

{
  byte bVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  QArrayDataPointer<QPainterPath::Element>::QArrayDataPointer
            (&(this->elements).d,&(other->elements).d);
  (this->pathConverter)._M_t.
  super___uniq_ptr_impl<QVectorPathConverter,_std::default_delete<QVectorPathConverter>_>._M_t.
  super__Tuple_impl<0UL,_QVectorPathConverter_*,_std::default_delete<QVectorPathConverter>_>.
  super__Head_base<0UL,_QVectorPathConverter_*,_false>._M_head_impl = (QVectorPathConverter *)0x0;
  QArrayDataPointer<double>::QArrayDataPointer(&(this->m_runLengths).d,&(other->m_runLengths).d);
  qVar2 = (other->bounds).xp;
  qVar3 = (other->bounds).yp;
  qVar4 = (other->bounds).h;
  (this->bounds).w = (other->bounds).w;
  (this->bounds).h = qVar4;
  (this->bounds).xp = qVar2;
  (this->bounds).yp = qVar3;
  qVar2 = (other->controlBounds).yp;
  qVar3 = (other->controlBounds).w;
  qVar4 = (other->controlBounds).h;
  (this->controlBounds).xp = (other->controlBounds).xp;
  (this->controlBounds).yp = qVar2;
  (this->controlBounds).w = qVar3;
  (this->controlBounds).h = qVar4;
  this->cStart = other->cStart;
  bVar1 = this->field_0x84;
  this->field_0x84 = bVar1 & 0xfe;
  bVar5 = other->field_0x84 & 2;
  this->field_0x84 = bVar1 & 0xfc | bVar5;
  bVar6 = other->field_0x84 & 4;
  this->field_0x84 = bVar1 & 0xf8 | bVar5 | bVar6;
  bVar7 = other->field_0x84 & 8;
  this->field_0x84 = bVar1 & 0xf0 | bVar5 | bVar6 | bVar7;
  bVar8 = other->field_0x84 & 0x10;
  this->field_0x84 = bVar1 & 0xe0 | bVar5 | bVar6 | bVar7 | bVar8;
  bVar9 = other->field_0x84 & 0x20;
  this->field_0x84 = bVar1 & 0xc0 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9;
  this->field_0x84 = bVar1 & 0x80 | bVar5 | bVar6 | bVar7 | bVar8 | bVar9 | other->field_0x84 & 0x40
  ;
  return;
}

Assistant:

QPainterPathPrivate(const QPainterPathPrivate &other) noexcept
        : QSharedData(other),
          elements(other.elements),
          m_runLengths(other.m_runLengths),
          bounds(other.bounds),
          controlBounds(other.controlBounds),
          cStart(other.cStart),
          require_moveTo(false),
          dirtyBounds(other.dirtyBounds),
          dirtyControlBounds(other.dirtyControlBounds),
          dirtyRunLengths(other.dirtyRunLengths),
          convex(other.convex),
          hasWindingFill(other.hasWindingFill),
          cacheEnabled(other.cacheEnabled)
    {
    }